

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t_backend.hpp
# Opt level: O3

number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
* std::
  numeric_limits<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>_>
  ::max(void)

{
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *in_RDI;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_40;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_28;
  
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  limits_helper_max<false>();
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            (&local_40,&local_28);
  local_40._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087a8;
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::dynamic_array
            (in_RDI,&local_40);
  in_RDI->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087a8;
  local_40._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_40.elem_count != 0) {
    operator_delete(local_40.elems,(ulong)local_40.elem_count << 2);
  }
  local_28._vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_002087f0;
  if ((ulong)local_28.elem_count != 0) {
    operator_delete(local_28.elems,(ulong)local_28.elem_count << 2);
  }
  return (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

static constexpr auto (max)        () -> boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<MyWidth2, MyLimbType, MyAllocatorType>, ExpressionTemplatesOptions> { return boost::multiprecision::uintwide_t_backend<MyWidth2, MyLimbType, MyAllocatorType>((std::numeric_limits<::math::wide_integer::uintwide_t<MyWidth2, MyLimbType, MyAllocatorType>>::max)()       ); }